

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_fcmla_zpzzz_h_aarch64(CPUARMState_conflict *env,void *vg,uint32_t desc)

{
  float_status *status;
  ushort uVar1;
  ulong uVar2;
  ushort uVar3;
  long lVar4;
  ushort uVar5;
  float16 fVar6;
  float16 fVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar12 = (ulong)((desc & 0x1f) * 8 + 8);
  status = &(env->vfp).fp_status_f16;
  lVar8 = (long)(env->vfp).zregs[0].d + ((ulong)(desc >> 7 & 0x1f00) - 2);
  uVar9 = (ulong)(desc >> 0xc & 0x1f00);
  uVar10 = (ulong)(desc >> 0x11 & 0x1f00);
  uVar11 = (ulong)(desc >> 2 & 0x1f00);
  do {
    uVar2 = *(ulong *)((long)vg + ((long)(uVar12 - 1) >> 6) * 8);
    uVar13 = uVar12;
    do {
      uVar12 = uVar13 - 4;
      bVar14 = (desc >> 0x1e & 1) != 0;
      uVar1 = *(ushort *)((long)(env->vfp).zregs[0].d + uVar13 + uVar9 + -4);
      lVar4 = lVar8 + -2;
      if (bVar14) {
        lVar4 = lVar8;
      }
      uVar5 = *(ushort *)((long)(env->vfp).zregs[0].d + uVar13 + uVar9 + -2);
      uVar3 = uVar1;
      if (!bVar14) {
        uVar3 = uVar5;
      }
      fVar7 = *(float16 *)(lVar4 + uVar13);
      if ((uVar2 >> ((uint)uVar12 & 0x3f) & 1) != 0) {
        if ((desc >> 0x1e & 1) == 0) {
          uVar5 = uVar1;
        }
        fVar6 = float16_muladd_aarch64
                          (fVar7,uVar5 ^ (ushort)((desc >> 0x1e) - 1 < 2) << 0xf,
                           *(float16 *)((long)(env->vfp).zregs[0].d + uVar13 + uVar10 + -4),0,status
                          );
        *(float16 *)((long)(env->vfp).zregs[0].d + uVar13 + uVar11 + -4) = fVar6;
      }
      if ((uVar2 >> (uVar13 - 2 & 0x3f) & 1) != 0) {
        fVar7 = float16_muladd_aarch64
                          (fVar7,uVar3 ^ (ushort)(desc >> 0x10) & 0x8000,
                           *(float16 *)((long)(env->vfp).zregs[0].d + uVar13 + uVar10 + -2),0,status
                          );
        *(float16 *)((long)(env->vfp).zregs[0].d + uVar13 + uVar11 + -2) = fVar7;
      }
      uVar13 = uVar12;
    } while ((uVar12 & 0x3f) != 0);
  } while (uVar12 != 0);
  return;
}

Assistant:

void HELPER(sve_fcmla_zpzzz_h)(CPUARMState *env, void *vg, uint32_t desc)
{
    intptr_t j, i = simd_oprsz(desc);
    unsigned rd = extract32(desc, SIMD_DATA_SHIFT, 5);
    unsigned rn = extract32(desc, SIMD_DATA_SHIFT + 5, 5);
    unsigned rm = extract32(desc, SIMD_DATA_SHIFT + 10, 5);
    unsigned ra = extract32(desc, SIMD_DATA_SHIFT + 15, 5);
    unsigned rot = extract32(desc, SIMD_DATA_SHIFT + 20, 2);
    bool flip = rot & 1;
    float16 neg_imag, neg_real;
    void *vd = &env->vfp.zregs[rd];
    void *vn = &env->vfp.zregs[rn];
    void *vm = &env->vfp.zregs[rm];
    void *va = &env->vfp.zregs[ra];
    uint64_t *g = vg;

    neg_imag = float16_set_sign(0, (rot & 2) != 0);
    neg_real = float16_set_sign(0, rot == 1 || rot == 2);

    do {
        uint64_t pg = g[(i - 1) >> 6];
        do {
            float16 e1, e2, e3, e4, nr, ni, mr, mi, d;

            /* I holds the real index; J holds the imag index.  */
            j = i - sizeof(float16);
            i -= 2 * sizeof(float16);

            nr = *(float16 *)((char *)vn + H1_2(i));
            ni = *(float16 *)((char *)vn + H1_2(j));
            mr = *(float16 *)((char *)vm + H1_2(i));
            mi = *(float16 *)((char *)vm + H1_2(j));

            e2 = (flip ? ni : nr);
            e1 = (flip ? mi : mr) ^ neg_real;
            e4 = e2;
            e3 = (flip ? mr : mi) ^ neg_imag;

            if (likely((pg >> (i & 63)) & 1)) {
                d = *(float16 *)((char *)va + H1_2(i));
                d = float16_muladd(e2, e1, d, 0, &env->vfp.fp_status_f16);
                *(float16 *)((char *)vd + H1_2(i)) = d;
            }
            if (likely((pg >> (j & 63)) & 1)) {
                d = *(float16 *)((char *)va + H1_2(j));
                d = float16_muladd(e4, e3, d, 0, &env->vfp.fp_status_f16);
                *(float16 *)((char *)vd + H1_2(j)) = d;
            }
        } while (i & 63);
    } while (i != 0);
}